

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O1

void testMinMaxEigenValue<Imath_2_5::Matrix33<float>>(Matrix33<float> *A)

{
  size_t i;
  long lVar1;
  float *pfVar2;
  float (*pafVar3) [3];
  size_t j;
  long lVar4;
  float fVar5;
  float fVar6;
  Matrix33<float> V;
  Matrix33<float> U;
  TV maxV;
  TV minV;
  TV S;
  Matrix33<float> A1;
  undefined8 local_d8;
  float afStack_d0 [10];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  Vec3 local_80 [12];
  Vec3 local_74 [12];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  float local_18;
  
  uStack_a0 = 0;
  uStack_90 = 0;
  local_a8 = 0x3f800000;
  local_98 = 0x3f800000;
  local_88 = 0x3f800000;
  afStack_d0[0] = 0.0;
  afStack_d0[1] = 0.0;
  afStack_d0[4] = 0.0;
  afStack_d0[5] = 0.0;
  local_d8 = 0x3f800000;
  afStack_d0[2] = 1.0;
  afStack_d0[3] = 0.0;
  afStack_d0[6] = 1.0;
  fVar5 = 0.0;
  lVar1 = 0;
  pafVar3 = (float (*) [3])A;
  do {
    lVar4 = 0;
    fVar6 = fVar5;
    do {
      fVar5 = ABS((*(float (*) [3])*pafVar3)[lVar4]);
      if (fVar5 <= fVar6) {
        fVar5 = fVar6;
      }
      lVar4 = lVar4 + 1;
      fVar6 = fVar5;
    } while (lVar4 != 3);
    lVar1 = lVar1 + 1;
    pafVar3 = pafVar3 + 1;
  } while (lVar1 != 3);
  fVar6 = 1.1920929e-07;
  if (1.1920929e-07 <= fVar5) {
    fVar6 = fVar5;
  }
  fVar5 = fVar6 * 100.0 * 1.1920929e-07;
  local_18 = A->x[2][2];
  local_38 = *(undefined8 *)A->x[0];
  uStack_30 = *(undefined8 *)(A->x[0] + 2);
  local_28 = *(undefined8 *)(A->x[1] + 1);
  uStack_20 = *(undefined8 *)A->x[2];
  Imath_2_5::minEigenVector<Imath_2_5::Matrix33<float>,Imath_2_5::Vec3<float>>
            ((Matrix33 *)&local_38,local_74);
  local_48 = A->x[2][2];
  local_68 = *(undefined8 *)A->x[0];
  uStack_60 = *(undefined8 *)(A->x[0] + 2);
  local_58 = *(undefined8 *)(A->x[1] + 1);
  uStack_50 = *(undefined8 *)A->x[2];
  Imath_2_5::maxEigenVector<Imath_2_5::Matrix33<float>,Imath_2_5::Vec3<float>>
            ((Matrix33 *)&local_68,local_80);
  local_18 = A->x[2][2];
  local_38 = *(undefined8 *)A->x[0];
  uStack_30 = *(undefined8 *)(A->x[0] + 2);
  local_28 = *(undefined8 *)(A->x[1] + 1);
  uStack_20 = *(undefined8 *)A->x[2];
  lVar1 = 0;
  Imath_2_5::jacobiSVD<float>
            ((Matrix33 *)&local_38,(Matrix33 *)&local_a8,(Vec3 *)&local_68,(Matrix33 *)&local_d8,
             1.1920929e-07,false);
  pfVar2 = afStack_d0;
  while( true ) {
    if (fVar5 <= ABS(*(float *)(local_74 + lVar1 * 4) - *pfVar2)) {
      __assert_fail("abs(minV[i]-V[i][dim - 1]) < threshold",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                    ,0xba,"void testMinMaxEigenValue(const TM &) [TM = Imath_2_5::Matrix33<float>]")
      ;
    }
    if (fVar5 <= ABS(*(float *)(local_80 + lVar1 * 4) - pfVar2[-2])) break;
    lVar1 = lVar1 + 1;
    pfVar2 = pfVar2 + 3;
    if (lVar1 == 3) {
      return;
    }
  }
  __assert_fail("abs(maxV[i]-V[i][0]) < threshold",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                ,0xbb,"void testMinMaxEigenValue(const TM &) [TM = Imath_2_5::Matrix33<float>]");
}

Assistant:

void
testMinMaxEigenValue(const TM& A)
{
  typedef typename TM::BaseVecType TV;
  typedef typename TM::BaseType T;

  TV minV, maxV, S;
  TM U, V;
  
  const T threshold = computeThreshold(A);

  {
      TM A1(A);
      minEigenVector(A1, minV);
      TM A2(A);
      maxEigenVector(A2, maxV);
  }
  {
      TM A3(A);
      jacobiSVD(A3, U, S, V);
  }

  const int dim = TM::dimensions();

  for(int i = 0; i < dim; ++i) {
      assert(abs(minV[i]-V[i][dim - 1]) < threshold);
      assert(abs(maxV[i]-V[i][0]) < threshold);
  }
}